

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

int __thiscall Escape::Graph::copy(Graph *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Graph *ret;
  Graph *this_local;
  
  newGraph(this,*(VertexIdx *)dst,*(EdgeIdx *)(dst + 8));
  std::copy<long*,long*>
            (*(long **)(dst + 0x10),(long *)(*(long *)(dst + 0x10) + *(long *)(dst + 8) * 8),
             this->srcs);
  std::copy<long*,long*>
            (*(long **)(dst + 0x18),(long *)(*(long *)(dst + 0x18) + *(long *)(dst + 8) * 8),
             this->dsts);
  return (int)this;
}

Assistant:

Graph Graph::copy() const {
    Graph ret = newGraph(nVertices, nEdges);
    std::copy(srcs, srcs + nEdges, ret.srcs);
    std::copy(dsts, dsts + nEdges, ret.dsts);
    return ret;
}